

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::parse_multipart_formdata(string *boundary,string *body,MultipartFiles *files)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar6;
  MultipartFile *this;
  bool bVar7;
  smatch m;
  string name;
  MultipartFile file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> dash_boundary;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> header;
  string_type local_50;
  
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::dash_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::dash_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::dash_abi_cxx11_,"--",(allocator *)&file);
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::dash_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::dash_abi_cxx11_);
  }
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::crlf_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::crlf_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::string::string
              ((string *)
               &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::crlf_abi_cxx11_,"\r\n",(allocator *)&file);
    __cxa_atexit(std::__cxx11::string::~string,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::crlf_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::crlf_abi_cxx11_);
  }
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::re_content_type_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::re_content_type_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::re_content_type_abi_cxx11_,"Content-Type: (.*?)",1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::re_content_type_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::re_content_type_abi_cxx11_);
  }
  if ((parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
       ::re_content_disposition_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::re_content_disposition_abi_cxx11_), iVar2 != 0)) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                ::re_content_disposition_abi_cxx11_,
               "Content-Disposition: form-data; name=\"(.*?)\"(?:; filename=\"(.*?)\")?",1);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::re_content_disposition_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                         ::re_content_disposition_abi_cxx11_);
  }
  std::operator+(&dash_boundary,
                 &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::dash_abi_cxx11_,boundary);
  bVar7 = false;
  lVar3 = std::__cxx11::string::find((string *)body,(ulong)&dash_boundary);
  if (lVar3 == 0) {
    lVar3 = std::__cxx11::string::find
                      ((string *)body,
                       (ulong)&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                               ::crlf_abi_cxx11_);
    if (lVar3 == -1) {
LAB_0015acee:
      bVar7 = false;
    }
    else {
      uVar5 = lVar3 + parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                      ::crlf_abi_cxx11_._M_string_length;
      do {
        bVar7 = body->_M_string_length <= uVar5;
        if (bVar7) {
          bVar7 = true;
          break;
        }
        uVar4 = std::__cxx11::string::find
                          ((string *)body,
                           (ulong)&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                   ::crlf_abi_cxx11_);
        if (uVar4 == 0xffffffffffffffff) goto LAB_0015acee;
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        name.field_2._M_local_buf[0] = '\0';
        file.filename._M_dataplus._M_p = (pointer)&file.filename.field_2;
        file.filename._M_string_length = 0;
        file.filename.field_2._M_local_buf[0] = '\0';
        file.content_type._M_dataplus._M_p = (pointer)&file.content_type.field_2;
        file.content_type._M_string_length = 0;
        file.content_type.field_2._M_local_buf[0] = '\0';
        file.offset = 0;
        file.length = 0;
        std::__cxx11::string::substr((ulong)&header,(ulong)body);
        while (uVar5 != uVar4) {
          m.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          m._M_begin._M_current = (char *)0x0;
          m.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          m.
          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          .
          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          bVar1 = std::
                  regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                            (&header,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                      *)&m,
                             &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                              ::re_content_type_abi_cxx11_,0);
          if (bVar1) {
            lVar3 = (long)m.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)m.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            if ((lVar3 == 0) || (0xfffffffffffffffd < lVar3 / 0x18 - 5U)) {
              psVar6 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)m.
                                 super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 .
                                 super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
            }
            else {
              psVar6 = m.
                       super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1;
            }
            std::__cxx11::
            sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::str(&local_50,psVar6);
            this = (MultipartFile *)&file.content_type;
LAB_0015aba9:
            std::__cxx11::string::operator=((string *)this,(string *)&local_50);
            std::__cxx11::string::~string((string *)&local_50);
          }
          else {
            bVar1 = std::
                    regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                              (&header,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                        *)&m,
                               &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                ::re_content_disposition_abi_cxx11_,0);
            if (bVar1) {
              lVar3 = (long)m.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)m.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              if ((lVar3 == 0) || (0xfffffffffffffffd < lVar3 / 0x18 - 5U)) {
                psVar6 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)m.
                                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
              }
              else {
                psVar6 = m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1;
              }
              std::__cxx11::
              sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::str(&local_50,psVar6);
              std::__cxx11::string::operator=((string *)&name,(string *)&local_50);
              std::__cxx11::string::~string((string *)&local_50);
              lVar3 = (long)m.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)m.
                            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
              if ((lVar3 == 0) || (0xfffffffffffffffc < lVar3 / 0x18 - 6U)) {
                psVar6 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)((long)m.
                                   super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x48);
              }
              else {
                psVar6 = m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2;
              }
              std::__cxx11::
              sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::str(&local_50,psVar6);
              this = &file;
              goto LAB_0015aba9;
            }
          }
          uVar5 = uVar4 + parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                          ::crlf_abi_cxx11_._M_string_length;
          uVar4 = std::__cxx11::string::find
                            ((string *)body,
                             (ulong)&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                     ::crlf_abi_cxx11_);
          if (uVar4 == 0xffffffffffffffff) {
            std::
            _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                             *)&m);
            bVar1 = false;
            goto LAB_0015acbb;
          }
          std::__cxx11::string::substr((ulong)&local_50,(ulong)body);
          std::__cxx11::string::operator=((string *)&header,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::
          _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)&m);
        }
        uVar4 = uVar5 + parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                        ::crlf_abi_cxx11_._M_string_length;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&m,
                       &parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                        ::crlf_abi_cxx11_,&dash_boundary);
        lVar3 = std::__cxx11::string::find((string *)body,(ulong)&m);
        std::__cxx11::string::~string((string *)&m);
        uVar5 = uVar4;
        if (lVar3 == -1) {
LAB_0015acb8:
          bVar1 = false;
        }
        else {
          file.length = lVar3 - uVar4;
          uVar5 = parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                  ::crlf_abi_cxx11_._M_string_length + lVar3 + dash_boundary._M_string_length;
          file.offset = uVar4;
          lVar3 = std::__cxx11::string::find
                            ((string *)body,
                             (ulong)&parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                                     ::crlf_abi_cxx11_);
          if (lVar3 == -1) goto LAB_0015acb8;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,httplib::MultipartFile>,std::_Select1st<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>
          ::_M_emplace_equal<std::__cxx11::string&,httplib::MultipartFile&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,httplib::MultipartFile>,std::_Select1st<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>
                      *)files,&name,&file);
          uVar5 = lVar3 + parse_multipart_formdata(std::__cxx11::string_const&,std::__cxx11::string_const&,std::multimap<std::__cxx11::string,httplib::MultipartFile,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,httplib::MultipartFile>>>&)
                          ::crlf_abi_cxx11_._M_string_length;
          bVar1 = true;
        }
LAB_0015acbb:
        std::__cxx11::string::~string((string *)&header);
        MultipartFile::~MultipartFile(&file);
        std::__cxx11::string::~string((string *)&name);
      } while (bVar1);
    }
  }
  std::__cxx11::string::~string((string *)&dash_boundary);
  return bVar7;
}

Assistant:

inline bool parse_multipart_formdata(
    const std::string& boundary, const std::string& body, MultipartFiles& files)
{
    static std::string dash = "--";
    static std::string crlf = "\r\n";

    static std::regex re_content_type(
        "Content-Type: (.*?)", std::regex_constants::icase);

    static std::regex re_content_disposition(
        "Content-Disposition: form-data; name=\"(.*?)\"(?:; filename=\"(.*?)\")?",
        std::regex_constants::icase);

    auto dash_boundary = dash + boundary;

    auto pos = body.find(dash_boundary);
    if (pos != 0) {
        return false;
    }

    pos += dash_boundary.size();

    auto next_pos = body.find(crlf, pos);
    if (next_pos == std::string::npos) {
        return false;
    }

    pos = next_pos + crlf.size();

    while (pos < body.size()) {
        next_pos = body.find(crlf, pos);
        if (next_pos == std::string::npos) {
            return false;
        }

        std::string name;
        MultipartFile file;

        auto header = body.substr(pos, (next_pos - pos));

        while (pos != next_pos) {
            std::smatch m;
            if (std::regex_match(header, m, re_content_type)) {
                file.content_type = m[1];
            } else if (std::regex_match(header, m, re_content_disposition)) {
                name = m[1];
                file.filename = m[2];
            }

            pos = next_pos + crlf.size();

            next_pos = body.find(crlf, pos);
            if (next_pos == std::string::npos) {
                return false;
            }

            header = body.substr(pos, (next_pos - pos));
        }

        pos = next_pos + crlf.size();

        next_pos = body.find(crlf + dash_boundary, pos);

        if (next_pos == std::string::npos) {
            return false;
        }

        file.offset = pos;
        file.length = next_pos - pos;

        pos = next_pos + crlf.size() + dash_boundary.size();

        next_pos = body.find(crlf, pos);
        if (next_pos == std::string::npos) {
            return false;
        }

        files.emplace(name, file);

        pos = next_pos + crlf.size();
    }

    return true;
}